

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

bool crnlib::rg_etc1::unpack_etc1_block
               (void *pETC1_block,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  ushort packed_color5;
  bool bVar8;
  uint uVar9;
  uint table_idx;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aaStack_58 [4];
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_48 [4];
  uint local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,preserve_alpha);
  bVar6 = *(byte *)((long)pETC1_block + 3);
  uVar7 = (uint)bVar6;
  table_idx = bVar6 >> 2 & 7;
  bVar1 = *pETC1_block;
  uVar9 = (uint)bVar1;
  if ((bVar6 & 2) == 0) {
    bVar2 = *(byte *)((long)pETC1_block + 1);
    local_38 = (uint)bVar6;
    bVar3 = *(byte *)((long)pETC1_block + 2);
    etc1_block::get_abs_subblock_colors
              ((color_quad_u8 *)&local_48[0].field_0,
               (ushort)((uVar9 & 0xf0) << 4) | (ushort)(byte)(bVar3 >> 4 | bVar2 & 0xf0),
               (uint)(bVar6 >> 5));
    uVar7 = local_38;
    etc1_block::get_abs_subblock_colors
              ((color_quad_u8 *)&aaStack_58[0].field_0,
               CONCAT11(bVar1,bVar2 << 4 | bVar3 & 0xf) & 0xfff,table_idx);
    bVar5 = true;
  }
  else {
    bVar1 = *(byte *)((long)pETC1_block + 1);
    bVar2 = *(byte *)((long)pETC1_block + 2);
    packed_color5 = (ushort)((uVar9 & 0xf8) << 7) | (ushort)(bVar2 >> 3) + (bVar1 & 0xfff8) * 4;
    etc1_block::get_diff_subblock_colors
              ((color_quad_u8 *)&local_48[0].field_0,packed_color5,(uint)(bVar6 >> 5));
    bVar5 = etc1_block::get_diff_subblock_colors
                      ((color_quad_u8 *)&aaStack_58[0].field_0,packed_color5,
                       (ushort)((uVar9 & 7) << 6) | (bVar2 & 7) + (bVar1 & 7) * 8,table_idx);
  }
  if ((char)local_34 == '\0') {
    if ((uVar7 & 1) == 0) {
      uVar7 = 0;
      do {
        *pDst_pixels_rgba =
             (uint)local_48[*(byte *)((long)&g_etc1_to_selector_index +
                                     (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >>
                                                     (uVar7 & 0x1f) & 1) != 0) +
                                            (*(byte *)((long)pETC1_block + 5) >>
                                             ((byte)uVar7 & 0x1f) & 1) * 2))];
        uVar9 = uVar7 + 4;
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[1] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (uVar9 & 0x1f) &
                                              1) != 0) +
                                      (*(byte *)((long)pETC1_block + 5) >> ((byte)uVar9 & 0x1f) & 1)
                                      * 2))];
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[2] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar7 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar7 & 0x1f) & 1) * 2))
             ];
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[3] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar9 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar9 & 0x1f) & 1) * 2))
             ];
        pDst_pixels_rgba =
             (uint *)((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba + 4);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
    }
    else {
      bVar6 = 0;
      bVar4 = true;
      do {
        bVar8 = bVar4;
        *pDst_pixels_rgba =
             (uint)local_48[*(byte *)((long)&g_etc1_to_selector_index +
                                     (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> bVar6 & 1)
                                                   != 0) +
                                            (*(byte *)((long)pETC1_block + 5) >> bVar6 & 1) * 2))];
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[1] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (bVar6 | 4) & 1)
                                             != 0) +
                                      (*(byte *)((long)pETC1_block + 5) >> (bVar6 | 4) & 1) * 2))];
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[2] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> bVar6 & 1) != 0)
                                      + (*(byte *)((long)pETC1_block + 4) >> bVar6 & 1) * 2))];
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[3] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (bVar6 | 4) & 1)
                                             != 0) +
                                      (*(byte *)((long)pETC1_block + 4) >> (bVar6 | 4) & 1) * 2))];
        pDst_pixels_rgba =
             (uint *)((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba + 4);
        bVar6 = 1;
        bVar4 = false;
      } while (bVar8);
      uVar7 = 2;
      do {
        *pDst_pixels_rgba =
             (uint)aaStack_58
                   [*(byte *)((long)&g_etc1_to_selector_index +
                             (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (uVar7 & 0x1f) & 1)
                                           != 0) +
                                    (*(byte *)((long)pETC1_block + 5) >> ((byte)uVar7 & 0x1f) & 1) *
                                    2))];
        uVar9 = uVar7 + 4;
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[1] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (uVar9 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 5) >> ((byte)uVar9 & 0x1f) & 1) * 2))
             ];
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[2] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar7 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar7 & 0x1f) & 1) * 2))
             ];
        ((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba)[3] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar9 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar9 & 0x1f) & 1) * 2))
             ];
        pDst_pixels_rgba =
             (uint *)((anon_union_4_3_dd316fa8_for_color_quad_u8_0 *)pDst_pixels_rgba + 4);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
    }
  }
  else if ((uVar7 & 1) == 0) {
    uVar7 = 0;
    do {
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (uVar7 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 5) >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      *(component_t *)pDst_pixels_rgba = local_48[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 1) = local_48[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 2) = local_48[bVar6].field_0.b;
      uVar9 = uVar7 + 4;
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (uVar9 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 5) >> ((byte)uVar9 & 0x1f) & 1) * 2))
      ;
      *(component_t *)(pDst_pixels_rgba + 1) = local_48[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 5) = local_48[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 6) = local_48[bVar6].field_0.b;
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar7 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      *(component_t *)(pDst_pixels_rgba + 2) = aaStack_58[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 9) = aaStack_58[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 10) = aaStack_58[bVar6].field_0.b;
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar9 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar9 & 0x1f) & 1) * 2))
      ;
      *(component_t *)(pDst_pixels_rgba + 3) = aaStack_58[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 0xd) = aaStack_58[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 0xe) = aaStack_58[bVar6].field_0.b;
      pDst_pixels_rgba = pDst_pixels_rgba + 4;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
  }
  else {
    bVar6 = 0;
    bVar4 = true;
    do {
      bVar8 = bVar4;
      bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> bVar6 & 1) != 0) +
                              (*(byte *)((long)pETC1_block + 5) >> bVar6 & 1) * 2));
      *(component_t *)pDst_pixels_rgba = local_48[bVar1].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 1) = local_48[bVar1].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 2) = local_48[bVar1].field_0.b;
      bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (bVar6 | 4) & 1) != 0) +
                              (*(byte *)((long)pETC1_block + 5) >> (bVar6 | 4) & 1) * 2));
      *(component_t *)(pDst_pixels_rgba + 1) = local_48[bVar1].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 5) = local_48[bVar1].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 6) = local_48[bVar1].field_0.b;
      bVar1 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> bVar6 & 1) != 0) +
                              (*(byte *)((long)pETC1_block + 4) >> bVar6 & 1) * 2));
      *(component_t *)(pDst_pixels_rgba + 2) = local_48[bVar1].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 9) = local_48[bVar1].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 10) = local_48[bVar1].field_0.b;
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (bVar6 | 4) & 1) != 0) +
                              (*(byte *)((long)pETC1_block + 4) >> (bVar6 | 4) & 1) * 2));
      *(component_t *)(pDst_pixels_rgba + 3) = local_48[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 0xd) = local_48[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 0xe) = local_48[bVar6].field_0.b;
      pDst_pixels_rgba = pDst_pixels_rgba + 4;
      bVar6 = 1;
      bVar4 = false;
    } while (bVar8);
    uVar7 = 2;
    do {
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (uVar7 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 5) >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      *(component_t *)pDst_pixels_rgba = aaStack_58[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 1) = aaStack_58[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 2) = aaStack_58[bVar6].field_0.b;
      uVar9 = uVar7 + 4;
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 7) >> (uVar9 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 5) >> ((byte)uVar9 & 0x1f) & 1) * 2))
      ;
      *(component_t *)(pDst_pixels_rgba + 1) = aaStack_58[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 5) = aaStack_58[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 6) = aaStack_58[bVar6].field_0.b;
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar7 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      *(component_t *)(pDst_pixels_rgba + 2) = aaStack_58[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 9) = aaStack_58[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 10) = aaStack_58[bVar6].field_0.b;
      bVar6 = *(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)((*(byte *)((long)pETC1_block + 6) >> (uVar9 & 0x1f) & 1) != 0)
                              + (*(byte *)((long)pETC1_block + 4) >> ((byte)uVar9 & 0x1f) & 1) * 2))
      ;
      *(component_t *)(pDst_pixels_rgba + 3) = aaStack_58[bVar6].field_0.r;
      *(component_t *)((long)pDst_pixels_rgba + 0xd) = aaStack_58[bVar6].field_0.g;
      *(component_t *)((long)pDst_pixels_rgba + 0xe) = aaStack_58[bVar6].field_0.b;
      pDst_pixels_rgba = pDst_pixels_rgba + 4;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 4);
  }
  return bVar5;
}

Assistant:

bool unpack_etc1_block(const void* pETC1_block, unsigned int* pDst_pixels_rgba, bool preserve_alpha)
        {
            color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
            const etc1_block& block = *static_cast<const etc1_block*>(pETC1_block);

            const bool diff_flag = block.get_diff_bit();
            const bool flip_flag = block.get_flip_bit();
            const uint table_index0 = block.get_inten_table(0);
            const uint table_index1 = block.get_inten_table(1);

            color_quad_u8 subblock_colors0[4];
            color_quad_u8 subblock_colors1[4];
            bool success = true;

            if (diff_flag)
            {
                const uint16 base_color5 = block.get_base5_color();
                const uint16 delta_color3 = block.get_delta3_color();
                etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

                if (!etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
                {
                    success = false;
                }
            }
            else
            {
                const uint16 base_color4_0 = block.get_base4_color(0);
                etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

                const uint16 base_color4_1 = block.get_base4_color(1);
                etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
            }

            if (preserve_alpha)
            {
                if (flip_flag)
                {
                    for (uint y = 0; y < 2; y++)
                    {
                        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
                        pDst += 4;
                    }

                    for (uint y = 2; y < 4; y++)
                    {
                        pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                        pDst += 4;
                    }
                }
                else
                {
                    for (uint y = 0; y < 4; y++)
                    {
                        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                        pDst += 4;
                    }
                }
            }
            else
            {
                if (flip_flag)
                {
                    // 0000
                    // 0000
                    // 1111
                    // 1111
                    for (uint y = 0; y < 2; y++)
                    {
                        pDst[0] = subblock_colors0[block.get_selector(0, y)];
                        pDst[1] = subblock_colors0[block.get_selector(1, y)];
                        pDst[2] = subblock_colors0[block.get_selector(2, y)];
                        pDst[3] = subblock_colors0[block.get_selector(3, y)];
                        pDst += 4;
                    }

                    for (uint y = 2; y < 4; y++)
                    {
                        pDst[0] = subblock_colors1[block.get_selector(0, y)];
                        pDst[1] = subblock_colors1[block.get_selector(1, y)];
                        pDst[2] = subblock_colors1[block.get_selector(2, y)];
                        pDst[3] = subblock_colors1[block.get_selector(3, y)];
                        pDst += 4;
                    }
                }
                else
                {
                    // 0011
                    // 0011
                    // 0011
                    // 0011
                    for (uint y = 0; y < 4; y++)
                    {
                        pDst[0] = subblock_colors0[block.get_selector(0, y)];
                        pDst[1] = subblock_colors0[block.get_selector(1, y)];
                        pDst[2] = subblock_colors1[block.get_selector(2, y)];
                        pDst[3] = subblock_colors1[block.get_selector(3, y)];
                        pDst += 4;
                    }
                }
            }

            return success;
        }